

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O0

void fill_with_pseudorandom_data(void *buffer,size_t size)

{
  FILE *__stream;
  int iVar1;
  char *__nptr;
  int *piVar2;
  char *pcVar3;
  char *seed_str;
  uint64_t seed;
  size_t size_local;
  void *buffer_local;
  
  __nptr = getenv("TEST_RANDOM_SEED");
  if (__nptr == (char *)0x0) {
    iVar1 = rand();
    seed_str = (char *)(long)iVar1;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    seed_str = (char *)strtoull(__nptr,(char **)0x0,10);
    piVar2 = __errno_location();
    __stream = _stderr;
    if (*piVar2 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(__stream,"strtoull(%s) failed: %s",__nptr,pcVar3);
      iVar1 = rand();
      seed_str = (char *)(long)iVar1;
    }
  }
  fill_with_pseudorandom_data_seed((uint64_t)seed_str,buffer,size);
  return;
}

Assistant:

void
fill_with_pseudorandom_data(void *buffer, size_t size)
{
	uint64_t seed;
	const char* seed_str;
	/*
	 * Check if a seed has been specified in the environment, otherwise fall
	 * back to using rand() as a seed.
	 */
	if ((seed_str = getenv("TEST_RANDOM_SEED")) != NULL) {
		errno = 0;
		seed = strtoull(seed_str, NULL, 10);
		if (errno != 0) {
			fprintf(stderr, "strtoull(%s) failed: %s", seed_str,
			    strerror(errno));
			seed = rand();
		}
	} else {
		seed = rand();
	}
	fill_with_pseudorandom_data_seed(seed, buffer, size);
}